

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O2

void __thiscall
Js::JavascriptPromiseThenFinallyFunction::JavascriptPromiseThenFinallyFunction
          (JavascriptPromiseThenFinallyFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          RecyclableObject *OnFinally,RecyclableObject *Constructor,bool shouldThrow)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0136faa8;
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(&this->OnFinally,OnFinally);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(&this->Constructor,Constructor);
  this->shouldThrow = shouldThrow;
  return;
}

Assistant:

JavascriptPromiseThenFinallyFunction(DynamicType* type, FunctionInfo* functionInfo, RecyclableObject* OnFinally, RecyclableObject* Constructor, bool shouldThrow)
            : RuntimeFunction(type, functionInfo), OnFinally(OnFinally), Constructor(Constructor), shouldThrow(shouldThrow)
        { }